

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall
Lowerer::InsertMoveForPolymorphicCacheIndex
          (Lowerer *this,Instr *instr,BailOutInfo *bailOutInfo,int bailOutRecordOffset,
          uint polymorphicCacheIndexValue)

{
  BailOutRecord *pBVar1;
  bool bVar2;
  Func *this_00;
  StackSym *sym;
  RegOpnd *baseOpnd;
  size_t sVar3;
  IntConstOpnd *src;
  IndirOpnd *local_30;
  Opnd *indexOpnd;
  uint polymorphicCacheIndexValue_local;
  int bailOutRecordOffset_local;
  BailOutInfo *bailOutInfo_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  bVar2 = Func::IsOOPJIT(this->m_func);
  if (bVar2) {
    this_00 = Func::GetTopFunc(this->m_func);
    sym = Func::GetNativeCodeDataSym(this_00);
    baseOpnd = IR::RegOpnd::New(sym,TyVar,this->m_func);
    sVar3 = BailOutRecord::GetOffsetOfPolymorphicCacheIndex();
    local_30 = IR::IndirOpnd::New(baseOpnd,bailOutRecordOffset + (int)sVar3,TyUint32,this->m_func,
                                  false);
  }
  else {
    pBVar1 = bailOutInfo->bailOutRecord;
    sVar3 = BailOutRecord::GetOffsetOfPolymorphicCacheIndex();
    local_30 = (IndirOpnd *)
               IR::MemRefOpnd::New((void *)((long)&pBVar1->globalBailOutRecordTable + sVar3),
                                   TyUint32,this->m_func,AddrOpndKindDynamicMisc);
  }
  src = IR::IntConstOpnd::New((ulong)polymorphicCacheIndexValue,TyUint32,this->m_func,false);
  InsertMove(&local_30->super_Opnd,&src->super_Opnd,instr,false);
  return;
}

Assistant:

void Lowerer::InsertMoveForPolymorphicCacheIndex(IR::Instr * instr, BailOutInfo * bailOutInfo, int bailOutRecordOffset, uint polymorphicCacheIndexValue)
{
    IR::Opnd * indexOpnd = nullptr;

    if (this->m_func->IsOOPJIT())
    {
        indexOpnd = IR::IndirOpnd::New(IR::RegOpnd::New(m_func->GetTopFunc()->GetNativeCodeDataSym(), TyVar, m_func), (int)(bailOutRecordOffset + BailOutRecord::GetOffsetOfPolymorphicCacheIndex()), TyUint32, m_func);
    }
    else
    {
        indexOpnd = IR::MemRefOpnd::New((BYTE*)bailOutInfo->bailOutRecord + BailOutRecord::GetOffsetOfPolymorphicCacheIndex(), TyUint32, this->m_func);
    }

    InsertMove(
        indexOpnd, IR::IntConstOpnd::New(polymorphicCacheIndexValue, TyUint32, this->m_func), instr, false);
}